

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_cond.cpp
# Opt level: O0

void __thiscall SharedCond::SharedCond(SharedCond *this)

{
  int iVar1;
  __pid_t _Var2;
  ContextManager *pCVar3;
  pointer this_00;
  pthread_cond_t *__cond;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  pthread_condattr_t local_28 [2];
  pthread_condattr_t condattr;
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  local_18;
  SharedCond *local_10;
  SharedCond *this_local;
  
  local_10 = this;
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,std::default_delete<SharedMemoryObject<pthread_cond_t>>>
  ::unique_ptr<std::default_delete<SharedMemoryObject<pthread_cond_t>>,void>
            ((unique_ptr<SharedMemoryObject<pthread_cond_t>,std::default_delete<SharedMemoryObject<pthread_cond_t>>>
              *)this);
  std::make_unique<SharedMemoryObject<pthread_cond_t>>();
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::operator=(&this->cond_,&local_18);
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::~unique_ptr(&local_18);
  iVar1 = pthread_condattr_init(local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Failed to initialize condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  iVar1 = pthread_condattr_setpshared(local_28,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_68,"Failed to set PTHREAD_PROCESS_SHARED to condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  this_00 = std::
            unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
            ::operator->(&this->cond_);
  __cond = (pthread_cond_t *)SharedMemoryObject<pthread_cond_t>::get(this_00);
  iVar1 = pthread_cond_init(__cond,local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_88,"Failed to initialize cond: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  iVar1 = pthread_condattr_destroy(local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_a8,"Failed to destroy condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  _Var2 = getpid();
  this->owner_pid_ = _Var2;
  return;
}

Assistant:

SharedCond::SharedCond() {
    cond_ = std::make_unique<SharedMemoryObject<pthread_cond_t>>();
    pthread_condattr_t condattr;
    if (pthread_condattr_init(&condattr) != 0) {
        die(format("Failed to initialize condattr: %m"));
    }
    if (pthread_condattr_setpshared(&condattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to condattr: %m"));
    }
    if (pthread_cond_init(cond_->get(), &condattr)) {
        die(format("Failed to initialize cond: %m"));
    }
    if (pthread_condattr_destroy(&condattr) != 0) {
        die(format("Failed to destroy condattr: %m"));
    }
    owner_pid_ = getpid();
}